

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lopcodes.c
# Opt level: O2

void ravi_print_function(membuff_t *mb,Proto *f,int full)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Instruction *pIVar5;
  TString *pTVar6;
  LocVar *pLVar7;
  Upvaldesc *pUVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  Proto *pPVar16;
  TString *pTVar17;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar18;
  undefined8 extraout_RDX_01;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  char *pcVar22;
  long lVar23;
  uint i;
  byte bVar24;
  uint uVar25;
  char *pcVar26;
  ulong uVar27;
  bool bVar28;
  
  pTVar17 = (TString *)"=?";
  if (f->source != (TString *)0x0) {
    pTVar17 = f->source + 1;
  }
  cVar1 = *(char *)&pTVar17->next;
  if (cVar1 == '\x1b') {
    pcVar12 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar12 = (char *)((long)&pTVar17->next + 1);
  }
  else {
    pcVar12 = "(string)";
  }
  uVar2 = f->sizep;
  pcVar14 = "function";
  pcVar19 = "s";
  pcVar22 = "s";
  if (f->linedefined == 0) {
    pcVar14 = "main";
  }
  if (f->sizecode == 1) {
    pcVar22 = "";
  }
  membuff_add_fstring(mb,"\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar14,pcVar12,
                      (ulong)(uint)f->linedefined,(ulong)(uint)f->lastlinedefined,
                      (ulong)(uint)f->sizecode,pcVar22,f);
  pcVar12 = "-+";
  pcVar14 = "s";
  pcVar22 = "s";
  pcVar26 = "s";
  if (f->is_vararg == '\0') {
    pcVar12 = "\x01";
  }
  if (f->numparams == 1) {
    pcVar14 = "";
  }
  if (f->maxstacksize == 1) {
    pcVar22 = "";
  }
  if (f->sizeupvalues == 1) {
    pcVar26 = "";
  }
  membuff_add_fstring(mb,"%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)f->numparams,pcVar12 + 1,
                      pcVar14,(ulong)f->maxstacksize,pcVar22,(ulong)(uint)f->sizeupvalues,pcVar26);
  pcVar12 = "s";
  pcVar14 = "s";
  if (f->sizelocvars == 1) {
    pcVar12 = "";
  }
  if (f->sizek == 1) {
    pcVar14 = "";
  }
  if (f->sizep == 1) {
    pcVar19 = "";
  }
  membuff_add_fstring(mb,"%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)f->sizelocvars,
                      pcVar12,(ulong)(uint)f->sizek,pcVar14,(ulong)(uint)f->sizep,pcVar19);
  pIVar5 = f->code;
  iVar3 = f->sizecode;
  uVar25 = 0;
  do {
    if (iVar3 <= (int)uVar25) {
      uVar25 = f->sizek;
      membuff_add_fstring(mb,"constants (%d) for %p:\n",(ulong)uVar25,f);
      uVar25 = ~((int)uVar25 >> 0x1f) & uVar25;
      uVar13 = 0;
      while (bVar28 = uVar25 != 0, uVar25 = uVar25 - 1, bVar28) {
        membuff_add_fstring(mb,"\t%d\t",(ulong)(uVar13 + 1));
        PrintConstant(mb,f,uVar13);
        membuff_add_fstring(mb,"\n");
        uVar13 = uVar13 + 1;
      }
      uVar25 = f->sizelocvars;
      membuff_add_fstring(mb,"locals (%d) for %p:\n",(ulong)uVar25,f);
      lVar23 = 0x14;
      for (uVar27 = 0; (~((int)uVar25 >> 0x1f) & uVar25) != uVar27; uVar27 = uVar27 + 1) {
        pLVar7 = f->locvars;
        membuff_add_fstring(mb,"\t%d\t%s\t%d\t%d\n",uVar27 & 0xffffffff,
                            *(long *)((long)pLVar7 + lVar23 + -0x14) + 0x18,
                            (ulong)(*(int *)((long)pLVar7 + lVar23 + -4) + 1),
                            (ulong)(*(int *)((long)&pLVar7->varname + lVar23) + 1));
        lVar23 = lVar23 + 0x20;
      }
      uVar25 = f->sizeupvalues;
      membuff_add_fstring(mb,"upvalues (%d) for %p:\n",(ulong)uVar25,f);
      lVar23 = 0x15;
      uVar18 = extraout_RDX;
      for (uVar27 = 0; (~((int)uVar25 >> 0x1f) & uVar25) != uVar27; uVar27 = uVar27 + 1) {
        pUVar8 = f->upvalues;
        lVar9 = *(long *)((long)pUVar8 + lVar23 + -0x15);
        pcVar12 = (char *)(lVar9 + 0x18);
        if (lVar9 == 0) {
          pcVar12 = "-";
        }
        membuff_add_fstring(mb,"\t%d\t%s\t%d\t%d\n",uVar27 & 0xffffffff,pcVar12,
                            (ulong)*(byte *)((long)pUVar8 + lVar23 + -1),
                            (ulong)*(byte *)((long)&pUVar8->name + lVar23));
        lVar23 = lVar23 + 0x18;
        uVar18 = extraout_RDX_00;
      }
      for (uVar27 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar27; uVar27 = uVar27 + 1) {
        ravi_print_function(mb,f->p[uVar27],(int)uVar18);
        uVar18 = extraout_RDX_01;
      }
      return;
    }
    uVar13 = 0xffffffff;
    if (f->lineinfo != (int *)0x0) {
      uVar13 = f->lineinfo[(int)uVar25];
    }
    uVar20 = uVar25 + 1;
    uVar4 = pIVar5[(int)uVar25];
    membuff_add_fstring(mb,"\t%d\t",(ulong)uVar20);
    if ((int)uVar13 < 1) {
      membuff_add_fstring(mb,"[-]\t");
    }
    else {
      membuff_add_fstring(mb,"[%d]\t",(ulong)uVar13);
    }
    uVar10 = uVar4 >> 8;
    i = uVar4 >> 0x10;
    uVar11 = uVar4 >> 0x18;
    uVar27 = (ulong)uVar11;
    uVar21 = (ulong)(uVar10 & 0x7f);
    uVar13 = i & 0xff;
    membuff_add_fstring(mb,"%-9s\t",luaP_opnames[uVar4 & 0xff]);
    bVar24 = luaP_opmodes[uVar4 & 0xff];
    switch(bVar24 & 3) {
    case 0:
      membuff_add_fstring(mb,"%d",uVar21);
      if ((bVar24 >> 4 & 3) != 0) {
        uVar15 = uVar27;
        if (((bVar24 >> 4 & 3) == 3) && ((int)uVar4 < 0)) {
          uVar15 = (ulong)(~uVar11 | 0xffffff80);
        }
        membuff_add_fstring(mb," %d",uVar15);
      }
      bVar24 = bVar24 >> 2 & 3;
      if (bVar24 != 0) {
        uVar15 = (ulong)uVar13;
        if ((bVar24 == 3) && (uVar15 = (ulong)uVar13, (uVar4 >> 0x17 & 1) != 0)) {
          uVar15 = (ulong)(~i | 0xffffff80);
        }
        pcVar12 = " %d";
        goto LAB_0011d13e;
      }
      break;
    case 1:
      membuff_add_fstring(mb,"%d",uVar21);
      if ((bVar24 & 0x30) == 0x10) {
        pcVar12 = " %d";
        uVar15 = (ulong)i;
      }
      else {
        if ((bVar24 & 0x30) != 0x30) break;
        pcVar12 = " %d";
        uVar15 = (ulong)~i;
      }
      goto LAB_0011d13e;
    case 2:
      membuff_add_fstring(mb,"%d %d",uVar21,(ulong)(i - 0x8000));
      break;
    case 3:
      pcVar12 = "%d";
      uVar15 = (ulong)~uVar10;
LAB_0011d13e:
      membuff_add_fstring(mb,pcVar12,uVar15);
    }
    switch(uVar4 & 0xff) {
    case 1:
      membuff_add_fstring(mb,"\t; ");
      goto LAB_0011d284;
    case 5:
    case 9:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
      pcVar12 = "\t; %s";
      pTVar17 = f->upvalues[uVar27].name;
      pPVar16 = (Proto *)(pTVar17 + 1);
      if (pTVar17 == (TString *)0x0) {
        pPVar16 = (Proto *)0x1561ee;
      }
      goto LAB_0011d252;
    case 6:
    case 0x73:
      pTVar6 = f->upvalues[uVar27].name;
      pTVar17 = pTVar6 + 1;
      if (pTVar6 == (TString *)0x0) {
        pTVar17 = (TString *)0x1561ee;
      }
      membuff_add_fstring(mb,"\t; %s",pTVar17);
      if ((uVar4 >> 0x17 & 1) != 0) {
        membuff_add_string(mb," ");
LAB_0011d27b:
        i = i & 0x7f;
        goto LAB_0011d284;
      }
      goto LAB_0011d28d;
    case 7:
    case 0xc:
    case 0x50:
    case 0x51:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x71:
      if ((uVar4 >> 0x17 & 1) != 0) {
        membuff_add_fstring(mb,"\t; ");
        goto LAB_0011d27b;
      }
      break;
    case 8:
      pTVar6 = f->upvalues[uVar21].name;
      pTVar17 = pTVar6 + 1;
      if (pTVar6 == (TString *)0x0) {
        pTVar17 = (TString *)0x1561ee;
      }
      membuff_add_fstring(mb,"\t; %s",pTVar17);
      if ((int)uVar4 < 0) {
        membuff_add_string(mb," ");
        PrintConstant(mb,f,uVar11 & 0x7f);
      }
      if ((uVar4 >> 0x17 & 1) != 0) {
        membuff_add_string(mb," ");
        goto LAB_0011d27b;
      }
      break;
    case 10:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6f:
    case 0x72:
      if ((uVar4 & 0x80800000) != 0) {
        membuff_add_fstring(mb,"\t; ");
        if ((int)uVar4 < 0) {
          PrintConstant(mb,f,uVar11 & 0x7f);
        }
        else {
          membuff_add_fstring(mb,"-");
        }
        membuff_add_string(mb," ");
        if ((uVar4 >> 0x17 & 1) != 0) goto LAB_0011d27b;
        membuff_add_fstring(mb,"-");
        goto LAB_0011d28d;
      }
      break;
    case 0x1e:
    case 0x27:
    case 0x28:
    case 0x2a:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
      pcVar12 = "\t; to %d";
      uVar13 = uVar25 + 2 + (i - 0x8000);
      goto LAB_0011d20d;
    case 0x2b:
      if (uVar13 == 0) {
        membuff_add_fstring(mb,"\t; %d",(ulong)pIVar5[(int)uVar20]);
        uVar20 = uVar25 + 2;
        goto LAB_0011d28d;
      }
      pcVar12 = "\t; %d";
LAB_0011d20d:
      membuff_add_fstring(mb,pcVar12,(ulong)uVar13);
      goto LAB_0011d28d;
    case 0x2c:
      pcVar12 = "\t; %p";
      pPVar16 = f->p[i];
LAB_0011d252:
      membuff_add_fstring(mb,pcVar12,pPVar16);
      goto LAB_0011d28d;
    case 0x2e:
      membuff_add_fstring(mb,"\t; ");
      i = uVar10;
LAB_0011d284:
      PrintConstant(mb,f,i);
      goto LAB_0011d28d;
    }
LAB_0011d28d:
    membuff_add_fstring(mb,"\n");
    uVar25 = uVar20;
  } while( true );
}

Assistant:

static void ravi_print_function(membuff_t *mb, const Proto* f, int full)
{
  int i, n = f->sizep;
  PrintHeader(mb, f);
  PrintCode(mb, f);
  if (full) PrintDebug(mb, f);
  for (i = 0; i<n; i++) ravi_print_function(mb, f->p[i], full);
}